

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall
Inject::implemented_by_scope_singleton::test_method(implemented_by_scope_singleton *this)

{
  undefined8 uVar1;
  bool bVar2;
  service *psVar3;
  service *psVar4;
  lazy_ostream *prev;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_128;
  assertion_result local_108;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  undefined1 local_d0 [8];
  injected<Inject::service> second;
  injected<Inject::service> first;
  context<0> c;
  implemented_by<Inject::impl1,_(inject::component_scope)1> xxxx;
  provides<Inject::service> xxx;
  component<Inject::impl1> local_20;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  implemented_by_scope_singleton *this_local;
  
  inject::context<0>::component<Inject::service>::component((component<Inject::service> *)&xx);
  inject::context<0>::component<Inject::impl1>::component(&local_20);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides
            ((provides<Inject::service> *)&xxxx);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)1>::implemented_by
            ((implemented_by<Inject::impl1,_(inject::component_scope)1> *)&c._parent);
  inject::context<0>::context((context<0> *)&first._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected
            ((injected<Inject::service> *)&second._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_d0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e0,0x7b,&local_f0);
    psVar3 = inject::context<0>::injected<Inject::service>::get
                       ((injected<Inject::service> *)&second._ptr.pn);
    psVar4 = inject::context<0>::injected<Inject::service>::get
                       ((injected<Inject::service> *)local_d0);
    boost::test_tools::assertion_result::assertion_result(&local_108,psVar3 == psVar4);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,"first.get() == second.get()",0x1b);
    boost::unit_test::operator<<(&local_128,prev,&local_138);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::test_tools::tt_detail::report_assertion(&local_108,&local_128,&local_148,0x7b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_128);
    boost::test_tools::assertion_result::~assertion_result(&local_108);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_d0);
  inject::context<0>::injected<Inject::service>::~injected
            ((injected<Inject::service> *)&second._ptr.pn);
  inject::context<0>::~context((context<0> *)&first._ptr.pn);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)1>::~implemented_by
            ((implemented_by<Inject::impl1,_(inject::component_scope)1> *)&c._parent);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::~provides
            ((provides<Inject::service> *)&xxxx);
  inject::context<0>::component<Inject::impl1>::~component(&local_20);
  inject::context<0>::component<Inject::service>::~component((component<Inject::service> *)&xx);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(implemented_by_scope_singleton)
{
    context<>::component<service> x;
    context<>::component<impl1> xx;
    context<>::component<impl1>::provides<service> xxx;
    context<>::component<service>::implemented_by<impl1, scope_singleton> xxxx;

    context<> c;

    context<>::injected<service> first;
    context<>::injected<service> second;
    BOOST_CHECK(first.get() == second.get());
}